

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

void __thiscall Moc::prependNamespaces(Moc *this,BaseDef *def,QList<NamespaceDef> *namespaceList)

{
  long lVar1;
  NamespaceDef *pNVar2;
  long lVar3;
  NamespaceDef *pNVar4;
  long in_FS_OFFSET;
  QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> local_60;
  QArrayDataPointer<char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (namespaceList->d).size;
  pNVar4 = (namespaceList->d).ptr + lVar3;
  pNVar2 = pNVar4;
  for (lVar3 = lVar3 * -0x90; lVar3 != 0; lVar3 = lVar3 + 0x90) {
    lVar1 = (this->super_Parser).index;
    if ((pNVar4[-1].super_BaseDef.begin < lVar1) && (lVar1 < pNVar2[-1].super_BaseDef.end + -1)) {
      local_60.b = (char (*) [3])0x133777;
      local_60.a = (QByteArray *)(pNVar2 + -1);
      QStringBuilder<const_QByteArray_&,_const_char_(&)[3]>::convertTo<QByteArray>
                ((QByteArray *)&local_50,&local_60);
      QByteArray::prepend(&def->qualified);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
    }
    pNVar4 = pNVar4 + -1;
    pNVar2 = pNVar2 + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Moc::prependNamespaces(BaseDef &def, const QList<NamespaceDef> &namespaceList) const
{
    auto it = namespaceList.crbegin();
    const auto rend = namespaceList.crend();
    for (; it != rend; ++it) {
        if (inNamespace(&*it))
            def.qualified.prepend(it->classname + "::");
    }
}